

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

STRING_HANDLE STRING_new_quoted(char *source)

{
  STRING_HANDLE __ptr;
  size_t __n;
  char *pcVar1;
  LOGGER_LOG p_Var2;
  size_t __size;
  
  if ((source != (char *)0x0) && (__ptr = (STRING_HANDLE)malloc(8), __ptr != (STRING_HANDLE)0x0)) {
    __n = strlen(source);
    __size = 0xffffffffffffffff;
    if (__n < 0xfffffffffffffffd) {
      __size = __n + 3;
    }
    if (__size != 0xffffffffffffffff) {
      pcVar1 = (char *)malloc(__size);
      __ptr->s = pcVar1;
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\"';
        memcpy(pcVar1 + 1,source,__n);
        (pcVar1 + __n + 1)[0] = '\"';
        (pcVar1 + __n + 1)[1] = '\0';
        return __ptr;
      }
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/strings.c"
                ,"STRING_new_quoted",0xf6,1,"Failure allocating quoted string value. size=%zu",
                __size);
    }
    free(__ptr);
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_new_quoted(const char* source)
{
    STRING* result;
    if (source == NULL)
    {
        /* Codes_SRS_STRING_07_009: [STRING_new_quoted shall return a NULL STRING_HANDLE if the supplied const char* is NULL.] */
        result = NULL;
    }
    else if ((result = (STRING*)malloc(sizeof(STRING))) != NULL)
    {
        size_t sourceLength = strlen(source);
        size_t malloc_size = safe_add_size_t(sourceLength, 3);
        if (malloc_size != SIZE_MAX && (result->s = (char*)malloc(malloc_size)) != NULL)
        {
            result->s[0] = '"';
            (void)memcpy(result->s + 1, source, sourceLength);
            result->s[sourceLength + 1] = '"';
            result->s[sourceLength + 2] = '\0';
        }
        else
        {
            /* Codes_SRS_STRING_07_031: [STRING_new_quoted shall return a NULL STRING_HANDLE if any error is encountered.] */
            LogError("Failure allocating quoted string value. size=%zu", malloc_size);
            free(result);
            result = NULL;
        }
    }
    return (STRING_HANDLE)result;
}